

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O1

int __thiscall tcu::x11::glx::GlxVisual::getAttrib(GlxVisual *this,int attribute)

{
  int iVar1;
  undefined8 in_RAX;
  TestError *this_00;
  int fbvalue;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = glXGetFBConfigAttrib
                    ((this->m_display->super_XlibDisplay).m_display,this->m_fbConfig,attribute,
                     &local_14);
  if (iVar1 == 0) {
    return local_14;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,"GLX call failed",
             "glXGetFBConfigAttrib(getXDisplay(), m_fbConfig, attribute, &fbvalue)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x127);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

int GlxVisual::getAttrib (int attribute)
{
	int fbvalue;
	TCU_CHECK_GLX_CONFIG(glXGetFBConfigAttrib(getXDisplay(), m_fbConfig, attribute, &fbvalue));
	return fbvalue;
}